

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O2

void duckdb_je_sec_mutex_stats_read(tsdn_t *tsdn,sec_t *sec,mutex_prof_data_t *mutex_prof_data)

{
  long *plVar1;
  uint uVar2;
  sec_shard_t *psVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  nstime_t *a;
  
  lVar7 = 0;
  for (uVar6 = 0; uVar6 < (sec->opts).nshards; uVar6 = uVar6 + 1) {
    malloc_mutex_lock(tsdn,(malloc_mutex_t *)((long)&(sec->shards->mtx).field_0 + lVar7));
    psVar3 = sec->shards;
    duckdb_je_nstime_add
              (&mutex_prof_data->tot_wait_time,(nstime_t *)((long)&(psVar3->mtx).field_0 + lVar7));
    a = (nstime_t *)((long)&(psVar3->mtx).field_0 + lVar7 + 8);
    iVar5 = duckdb_je_nstime_compare(a,&mutex_prof_data->max_wait_time);
    if (0 < iVar5) {
      duckdb_je_nstime_copy(&mutex_prof_data->max_wait_time,a);
    }
    plVar1 = (long *)((long)&(psVar3->mtx).field_0 + lVar7 + 0x10);
    lVar4 = plVar1[1];
    mutex_prof_data->n_wait_times = mutex_prof_data->n_wait_times + *plVar1;
    mutex_prof_data->n_spin_acquired = mutex_prof_data->n_spin_acquired + lVar4;
    uVar2 = *(uint *)((long)&(psVar3->mtx).field_0 + lVar7 + 0x20);
    if (mutex_prof_data->max_n_thds < uVar2) {
      mutex_prof_data->max_n_thds = uVar2;
    }
    (mutex_prof_data->n_waiting_thds).repr = 0;
    mutex_prof_data->n_owner_switches =
         mutex_prof_data->n_owner_switches + *(long *)((long)&(psVar3->mtx).field_0 + lVar7 + 0x28);
    mutex_prof_data->n_lock_ops =
         mutex_prof_data->n_lock_ops + *(long *)((long)&(psVar3->mtx).field_0 + lVar7 + 0x38);
    psVar3 = sec->shards;
    *(undefined1 *)((long)&(psVar3->mtx).field_0 + lVar7 + 0x40) = 0;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(psVar3->mtx).field_0 + lVar7 + 0x48));
    lVar7 = lVar7 + 0x90;
  }
  return;
}

Assistant:

void
sec_mutex_stats_read(tsdn_t *tsdn, sec_t *sec,
    mutex_prof_data_t *mutex_prof_data) {
	for (size_t i = 0; i < sec->opts.nshards; i++) {
		malloc_mutex_lock(tsdn, &sec->shards[i].mtx);
		malloc_mutex_prof_accum(tsdn, mutex_prof_data,
		    &sec->shards[i].mtx);
		malloc_mutex_unlock(tsdn, &sec->shards[i].mtx);
	}
}